

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O3

CURLcode ws_flush(Curl_easy *data,websocket *ws,_Bool blocking)

{
  curl_trc_feat *pcVar1;
  _Bool _Var2;
  CURLcode CVar3;
  size_t sVar4;
  char **in_RCX;
  bufq *q;
  size_t outlen;
  size_t n;
  uchar *out;
  char *local_48;
  char *local_40;
  websocket *local_38;
  
  q = &ws->sendbuf;
  _Var2 = Curl_bufq_is_empty(q);
  CVar3 = CURLE_OK;
  if ((!_Var2) && (_Var2 = Curl_bufq_peek(q,(uchar **)&local_38,(size_t *)&local_48), _Var2)) {
    while (blocking) {
      CVar3 = ws_send_raw_blocking(data,local_38,local_48,(size_t)in_RCX);
      local_40 = local_48;
      if (CVar3 != CURLE_OK) {
        local_40 = (char *)0x0;
      }
LAB_0016518b:
      if (CVar3 != CURLE_OK) {
        if (CVar3 != CURLE_AGAIN) {
          Curl_failf(data,"WS: flush, write error %d",(ulong)CVar3);
          return CVar3;
        }
        if (data == (Curl_easy *)0x0) {
          return CURLE_AGAIN;
        }
        goto LAB_0016523b;
      }
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
         ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))))
      {
        Curl_infof(data,"WS: flushed %zu bytes",local_40);
      }
      Curl_bufq_skip(q,(size_t)local_40);
      _Var2 = Curl_bufq_peek(q,(uchar **)&local_38,(size_t *)&local_48);
      if (!_Var2) {
        return CURLE_OK;
      }
    }
    if (((data->set).connect_only != '\0') || (_Var2 = Curl_is_in_callback(data), _Var2)) {
      in_RCX = &local_40;
      CVar3 = Curl_senddata(data,local_38,(size_t)local_48,(size_t *)in_RCX);
      goto LAB_0016518b;
    }
    in_RCX = (char **)0x0;
    CVar3 = Curl_xfer_send(data,local_38,(size_t)local_48,false,(size_t *)&local_40);
    if (((CVar3 != CURLE_OK) || (local_40 != (char *)0x0)) || (local_48 == (char *)0x0))
    goto LAB_0016518b;
LAB_0016523b:
    CVar3 = CURLE_AGAIN;
    if (((((data->set).field_0x8cd & 0x10) != 0) &&
        ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))))
       && (0 < Curl_trc_feat_ws.log_level)) {
      sVar4 = Curl_bufq_len(q);
      Curl_trc_ws(data,"flush EAGAIN, %zu bytes remain in buffer",sVar4);
    }
  }
  return CVar3;
}

Assistant:

static CURLcode ws_flush(struct Curl_easy *data, struct websocket *ws,
                         bool blocking)
{
  if(!Curl_bufq_is_empty(&ws->sendbuf)) {
    CURLcode result;
    const unsigned char *out;
    size_t outlen, n;

    while(Curl_bufq_peek(&ws->sendbuf, &out, &outlen)) {
      if(blocking) {
        result = ws_send_raw_blocking(data, ws, (char *)out, outlen);
        n = result ? 0 : outlen;
      }
      else if(data->set.connect_only || Curl_is_in_callback(data))
        result = Curl_senddata(data, out, outlen, &n);
      else {
        result = Curl_xfer_send(data, out, outlen, FALSE, &n);
        if(!result && !n && outlen)
          result = CURLE_AGAIN;
      }

      if(result == CURLE_AGAIN) {
        CURL_TRC_WS(data, "flush EAGAIN, %zu bytes remain in buffer",
                    Curl_bufq_len(&ws->sendbuf));
        return result;
      }
      else if(result) {
        failf(data, "WS: flush, write error %d", result);
        return result;
      }
      else {
        infof(data, "WS: flushed %zu bytes", n);
        Curl_bufq_skip(&ws->sendbuf, n);
      }
    }
  }
  return CURLE_OK;
}